

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * TEST_multiple_positional_array_argument2(void)

{
  int *piVar1;
  float *pfVar2;
  int *piVar3;
  float *pfVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  undefined8 *puVar10;
  char **ppcVar11;
  ulong uVar12;
  byte bVar13;
  cargo_t cargo;
  size_t m_count;
  size_t j_count;
  float m [3];
  int j [3];
  int i;
  char *args [9];
  
  bVar13 = 0;
  iVar5 = cargo_init(&cargo,0,"program");
  if (iVar5 == 0) {
    j_count = 0;
    m_count = 0;
    puVar10 = &DAT_0012ffe0;
    ppcVar11 = args;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      *ppcVar11 = (char *)*puVar10;
      puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
      ppcVar11 = ppcVar11 + (ulong)bVar13 * -2 + 1;
    }
    iVar5 = cargo_add_option(cargo,0,"alpha","The alpha",".[i]#",j,&j_count,3);
    iVar6 = cargo_add_option(cargo,0,"mad","Mutual Assured Destruction",".[f]#",m,&m_count,3);
    iVar7 = cargo_add_option(cargo,0,"--beta -b","The beta","i",&i);
    if (iVar7 == 0 && (iVar6 == 0 && iVar5 == 0)) {
      iVar5 = cargo_parse(cargo,0,1,9,args);
      for (uVar12 = 0; uVar12 < j_count; uVar12 = uVar12 + 1) {
        printf("alpha = %d\n",(ulong)(uint)j[uVar12]);
      }
      for (uVar12 = 0; uVar12 < m_count; uVar12 = uVar12 + 1) {
        printf("mad = %f\n",(double)m[uVar12]);
      }
      if (iVar5 == 0) {
        puts("Check that \"j\" has 3 elements");
        if (j_count == 3) {
          pcVar9 = "Array contains unexpected value";
          lVar8 = 0;
          do {
            if (lVar8 == 0xc) {
              puts("Check that \"m\" has 3 elements");
              if (m_count == 3) {
                lVar8 = 0;
                goto LAB_00114498;
              }
              pcVar9 = "m array count m_count is not expected 3";
              break;
            }
            piVar3 = (int *)((long)j + lVar8);
            piVar1 = (int *)((long)&DAT_0012018c + lVar8);
            lVar8 = lVar8 + 4;
          } while (*piVar3 == *piVar1);
        }
        else {
          pcVar9 = "j array count j_count is not expected 3";
        }
      }
      else {
        pcVar9 = "Failed to parse positional argument";
      }
    }
    else {
      pcVar9 = "Failed to add options";
    }
LAB_001144bd:
    cargo_destroy(&cargo);
  }
  else {
    pcVar9 = "Failed to init cargo";
  }
  return pcVar9;
LAB_00114498:
  if (lVar8 == 0xc) {
    pcVar9 = (char *)0x0;
    goto LAB_001144bd;
  }
  pfVar4 = (float *)((long)m + lVar8);
  pfVar2 = (float *)((long)&DAT_00120180 + lVar8);
  lVar8 = lVar8 + 4;
  if ((*pfVar4 != *pfVar2) || (NAN(*pfVar4) || NAN(*pfVar2))) goto LAB_001144bd;
  goto LAB_00114498;
}

Assistant:

_TEST_START(TEST_multiple_positional_array_argument2)
{
    // Shuffle the order of arguments
    size_t k;
    int i;
    int j[3];
    int j_expect[] = { 456, 789, 101112 };
    size_t j_count = 0;
    float m[3];
    float m_expect[] = { 4.3f, 2.3f, 50.34f };
    size_t m_count = 0;
    char *args[] =
    {
        "program",
        "456", "789", "101112",
        "--beta", "123",
        "4.3", "2.3", "50.34"
    };

    ret |= cargo_add_option(cargo, 0, "alpha", "The alpha", ".[i]#",
                            &j, &j_count, 3);
    ret |= cargo_add_option(cargo, 0, "mad", "Mutual Assured Destruction", ".[f]#",
                            &m, &m_count, 3);
    ret |= cargo_add_option(cargo, 0, "--beta -b", "The beta", "i", &i);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);

    for (k = 0; k < j_count; k++)
    {
        printf("alpha = %d\n", j[k]);
    }

    for (k = 0; k < m_count; k++)
    {
        printf("mad = %f\n", m[k]);
    }

    cargo_assert(ret == 0, "Failed to parse positional argument");
    cargo_assert_array(j_count, 3, j, j_expect);
    cargo_assert(m, "m is NULL");
    cargo_assert_array(m_count, 3, m, m_expect);

    _TEST_CLEANUP();
}